

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O1

void __thiscall ParserTest_Directive_Test::TestBody(ParserTest_Directive_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *in_RDX;
  char *s;
  char *s_00;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  string local_40;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  (anonymous_namespace)::Parse_abi_cxx11_(&local_40,(_anonymous_namespace_ *)".. test::",in_RDX);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_20,"\"<test />\"","Parse(\".. test::\")",(char (*) [9])"<test />",&local_40);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (anonymous_namespace)::Parse_abi_cxx11_(&local_40,(_anonymous_namespace_ *)"..  test::",s);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_20,"\"<test />\"","Parse(\"..  test::\")",(char (*) [9])"<test />",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (anonymous_namespace)::Parse_abi_cxx11_(&local_40,(_anonymous_namespace_ *)"..\ttest::",s_00);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_20,"\"<test />\"","Parse(\"..\\ttest::\")",(char (*) [9])"<test />",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ParserTest, Directive) {
  EXPECT_EQ("<test />", Parse(".. test::"));
  EXPECT_EQ("<test />", Parse("..  test::"));
  EXPECT_EQ("<test />", Parse("..\ttest::"));
}